

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex.cpp
# Opt level: O1

Element ftxui::notflex(Element *child)

{
  shared_ptr<ftxui::(anonymous_namespace)::Flex> sVar1;
  Element EVar2;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  sVar1 = std::
          make_shared<ftxui::(anonymous_namespace)::Flex,void(&)(ftxui::Requirement&),std::shared_ptr<ftxui::Node>>
                    ((_func_void_Requirement_ptr *)&local_20,
                     (shared_ptr<ftxui::Node> *)anon_unknown_2::function_not_flex);
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<ftxui::(anonymous_namespace)::Flex,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_20;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = local_18;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)child;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element notflex(Element child) {
  return std::make_shared<Flex>(function_not_flex, std::move(child));
}